

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AsinhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_asinh(NeuralNetworkLayer *this)

{
  bool bVar1;
  AsinhLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_asinh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_asinh(this);
    this_00 = (AsinhLayerParams *)operator_new(0x18);
    AsinhLayerParams::AsinhLayerParams(this_00);
    (this->layer_).asinh_ = this_00;
  }
  return (AsinhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AsinhLayerParams* NeuralNetworkLayer::mutable_asinh() {
  if (!has_asinh()) {
    clear_layer();
    set_has_asinh();
    layer_.asinh_ = new ::CoreML::Specification::AsinhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.asinh)
  return layer_.asinh_;
}